

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa20.cpp
# Opt level: O1

void __thiscall salsa20::salsa20(salsa20 *this,string *key,string *nonce)

{
  ulong uVar1;
  undefined8 uVar2;
  size_t __n;
  array<unsigned_char,_32UL> key_array;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  uVar1 = key->_M_string_length;
  if (uVar1 != 0) {
    __n = 0x20;
    if (uVar1 < 0x20) {
      __n = uVar1;
    }
    memcpy(&local_38,(key->_M_dataplus)._M_p,__n);
  }
  uVar2 = *(undefined8 *)(nonce->_M_dataplus)._M_p;
  (this->m_array)._M_elems[0] = 0;
  (this->m_array)._M_elems[1] = 0;
  (this->m_array)._M_elems[2] = 0;
  (this->m_array)._M_elems[3] = 0;
  (this->m_array)._M_elems[4] = 0;
  (this->m_array)._M_elems[5] = 0;
  (this->m_array)._M_elems[6] = 0;
  (this->m_array)._M_elems[7] = 0;
  (this->m_array)._M_elems[8] = 0;
  (this->m_array)._M_elems[9] = 0;
  (this->m_array)._M_elems[10] = 0;
  (this->m_array)._M_elems[0xb] = 0;
  (this->m_array)._M_elems[0xc] = 0;
  (this->m_array)._M_elems[0xd] = 0;
  (this->m_array)._M_elems[0xe] = 0;
  (this->m_array)._M_elems[0xf] = 0;
  (this->m_array)._M_elems[0] = 0x63617571;
  (this->m_array)._M_elems[1] = (uint)local_38;
  (this->m_array)._M_elems[2] = local_38._4_4_;
  (this->m_array)._M_elems[3] = (uint)uStack_30;
  (this->m_array)._M_elems[4] = uStack_30._4_4_;
  (this->m_array)._M_elems[5] = 0x6f63206b;
  *(undefined8 *)((this->m_array)._M_elems + 6) = uVar2;
  (this->m_array)._M_elems[10] = 0x6174736e;
  (this->m_array)._M_elems[0xb] = (uint)local_28;
  (this->m_array)._M_elems[0xc] = local_28._4_4_;
  (this->m_array)._M_elems[0xd] = (uint)uStack_20;
  (this->m_array)._M_elems[0xe] = uStack_20._4_4_;
  (this->m_array)._M_elems[0xf] = 0x2121746e;
  return;
}

Assistant:

salsa20::salsa20(const std::string &key, const std::string &nonce)
{
    /* if key size is not same sizes::key_size
     * copy part of key, or all key bytes and fill other by 0x0
     */
    std::array<uint8_t, sizes::key_size> key_array;
    key_array.fill(0x0);
    long minimal_size = sizes::key_size < key.length() ? sizes::key_size : static_cast<long>(key.length());
    std::copy(key.begin(), key.begin() + minimal_size, key_array.data());

    std::array<uint8_t, sizes::nonce_size> nonce_array;
    nonce_array.fill(0x0);
    minimal_size = sizes::nonce_size < nonce.length() ? sizes::key_size : static_cast<long>(nonce.length());
    std::copy(nonce.begin(), nonce.begin() + nonce_array.size(), nonce_array.data());

    m_array.fill(0x0);

    // initial state of array
    m_array[0] = convert(&constants[0]);
    m_array[1] = convert(&key_array[0]);
    m_array[2] = convert(&key_array[4]);
    m_array[3] = convert(&key_array[8]);
    m_array[4] = convert(&key_array[12]);
    m_array[5] = convert(&constants[4]);

    m_array[6] = convert(&nonce_array[0]);
    m_array[7] = convert(&nonce_array[sizeof (uint32_t)]);

    m_array[10] = convert(&constants[8]);
    m_array[11] = convert(&key_array[16]);
    m_array[12] = convert(&key_array[20]);
    m_array[13] = convert(&key_array[24]);
    m_array[14] = convert(&key_array[28]);
    m_array[15] = convert(&constants[12]);
}